

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O1

double residual_norm_C(double *approximation,uint dimension,double *space_coordinate,
                      double time_upper_boundary,_func_double_double_double *approximated)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  
  dVar5 = *approximation;
  dVar2 = (*approximated)(*space_coordinate,time_upper_boundary);
  dVar5 = ABS(dVar5 - dVar2);
  if (1 < dimension) {
    uVar4 = 1;
    dVar2 = dVar5;
    do {
      dVar1 = approximation[uVar4];
      dVar3 = (*approximated)(space_coordinate[uVar4],time_upper_boundary);
      dVar5 = ABS(dVar1 - dVar3);
      if (ABS(dVar1 - dVar3) <= dVar2) {
        dVar5 = dVar2;
      }
      uVar4 = uVar4 + 1;
      dVar2 = dVar5;
    } while (dimension != uVar4);
  }
  return dVar5;
}

Assistant:

double residual_norm_C (double const * approximation, 
                        unsigned dimension, 
                        double const * space_coordinate, 
                        double time_upper_boundary,
                        double (*approximated) (double, double)) {
  double norm = fabs (approximation[0] - approximated (space_coordinate[0], time_upper_boundary));
  unsigned space_step;
  for (space_step = 1; space_step < dimension; ++space_step) {
    norm = max (fabs (approximation[space_step] - approximated (space_coordinate[space_step], time_upper_boundary)), norm);
  }
  return norm;
}